

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

X509_LOOKUP * X509_STORE_add_lookup(X509_STORE *v,X509_LOOKUP_METHOD *m)

{
  stack_st_X509_LOOKUP *sk_00;
  X509_LOOKUP *pXVar1;
  X509_LOOKUP *pXVar2;
  size_t sVar3;
  X509_LOOKUP *lu;
  X509_LOOKUP *lu_1;
  size_t i;
  stack_st_X509_LOOKUP *sk;
  X509_LOOKUP_METHOD *m_local;
  X509_STORE *v_local;
  
  sk_00 = (stack_st_X509_LOOKUP *)v->check_revocation;
  lu_1 = (X509_LOOKUP *)0x0;
  while( true ) {
    pXVar1 = (X509_LOOKUP *)sk_X509_LOOKUP_num(sk_00);
    if (pXVar1 <= lu_1) {
      v_local = (X509_STORE *)X509_LOOKUP_new(m);
      if ((v_local == (X509_STORE *)0x0) ||
         (sVar3 = sk_X509_LOOKUP_push((stack_st_X509_LOOKUP *)v->check_revocation,
                                      (X509_LOOKUP *)v_local), sVar3 == 0)) {
        X509_LOOKUP_free((X509_LOOKUP *)v_local);
        v_local = (X509_STORE *)0x0;
      }
      return (X509_LOOKUP *)v_local;
    }
    pXVar2 = (X509_LOOKUP *)sk_X509_LOOKUP_value(sk_00,(size_t)lu_1);
    if (m == *(X509_LOOKUP_METHOD **)&pXVar2->init) break;
    lu_1 = (X509_LOOKUP *)((long)&lu_1->method + 1);
  }
  return pXVar2;
}

Assistant:

X509_LOOKUP *X509_STORE_add_lookup(X509_STORE *v, const X509_LOOKUP_METHOD *m) {
  STACK_OF(X509_LOOKUP) *sk = v->get_cert_methods;
  for (size_t i = 0; i < sk_X509_LOOKUP_num(sk); i++) {
    X509_LOOKUP *lu = sk_X509_LOOKUP_value(sk, i);
    if (m == lu->method) {
      return lu;
    }
  }

  X509_LOOKUP *lu = X509_LOOKUP_new(m, v);
  if (lu == NULL || !sk_X509_LOOKUP_push(v->get_cert_methods, lu)) {
    X509_LOOKUP_free(lu);
    return NULL;
  }

  return lu;
}